

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfPartType.cpp
# Opt level: O3

bool Imf_3_2::isDeepData(string *name)

{
  size_t __n;
  int iVar1;
  bool bVar2;
  
  __n = name->_M_string_length;
  if (__n == DAT_003daef0) {
    if (__n == 0) {
      return true;
    }
    iVar1 = bcmp((name->_M_dataplus)._M_p,DEEPTILE_abi_cxx11_,__n);
    if (iVar1 == 0) {
      return true;
    }
  }
  if (__n == DAT_003daed0) {
    if (__n == 0) {
      bVar2 = true;
    }
    else {
      iVar1 = bcmp((name->_M_dataplus)._M_p,DEEPSCANLINE_abi_cxx11_,__n);
      bVar2 = iVar1 == 0;
    }
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool
isDeepData (const string& name)
{
    return (name == DEEPTILE || name == DEEPSCANLINE);
}